

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

DestructuringDecl * __thiscall SQASTReader::readDestructuringDecl(SQASTReader *this)

{
  Decl *pDVar1;
  int iVar2;
  DestructuringDecl *g;
  Expr *pEVar3;
  
  g = newNode<SQCompilation::DestructuringDecl,Arena*,SQCompilation::DestructuringType>
                (this,this->astArena,DT_TABLE);
  readDeclGroupBody(this,&g->super_DeclGroup);
  iVar2 = (**this->stream->_vptr_InputStream)();
  g->_dt_type = (int)(char)iVar2;
  pEVar3 = readExpression(this);
  g->_expr = pEVar3;
  iVar2 = (pEVar3->super_Node)._coordinates.columnEnd;
  pDVar1 = &(g->super_DeclGroup).super_Decl;
  (pDVar1->super_Statement).super_Node._coordinates.lineEnd =
       (pEVar3->super_Node)._coordinates.lineEnd;
  (pDVar1->super_Statement).super_Node._coordinates.columnEnd = iVar2;
  return g;
}

Assistant:

DestructuringDecl *SQASTReader::readDestructuringDecl() {
  DestructuringDecl *g = newNode<DestructuringDecl>(astArena, DT_TABLE);

  readDeclGroupBody(g);

  enum DestructuringType type = (enum DestructuringType)stream->readInt8();

  g->setType(type);
  g->setExpression(readExpression());

  return g;
}